

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O2

void __thiscall
CommandDrawSwitchableImage::Tick
          (CommandDrawSwitchableImage *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,
          bool hudChanged)

{
  player_t *ppVar1;
  APlayerPawn *pAVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  PClassActor *pPVar6;
  AInventory *pAVar7;
  FTexture *pFVar8;
  byte bVar9;
  int i;
  long lVar10;
  bool bVar11;
  byte bVar12;
  long lVar13;
  int iVar14;
  FName species;
  FName local_34;
  
  switch(this->condition) {
  case WEAPONSLOT:
    lVar13 = 0;
    iVar14 = 1;
    lVar10 = 0;
    while( true ) {
      ppVar1 = (statusBar->super_DBaseStatusBar).CPlayer;
      if ((int)(ppVar1->weapons).Slots[this->conditionalValue[0]].Weapons.Count <= lVar10) break;
      pPVar6 = *(PClassActor **)
                ((long)&((ppVar1->weapons).Slots[this->conditionalValue[0]].Weapons.Array)->Type +
                lVar13);
      if ((pPVar6 != (PClassActor *)0x0) &&
         (pAVar7 = AActor::FindInventory(&ppVar1->mo->super_AActor,pPVar6,false),
         pAVar7 != (AInventory *)0x0)) goto LAB_004b5554;
      lVar10 = lVar10 + 1;
      lVar13 = lVar13 + 0x10;
    }
    goto LAB_004b559a;
  case INVULNERABILITY:
    if ((((statusBar->super_DBaseStatusBar).CPlayer)->cheats & 0x2000002U) == 0) goto LAB_004b5554;
    break;
  case KEYSLOT:
    pAVar7 = GC::ReadBarrier<AInventory>
                       ((AInventory **)
                        &(((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor).Inventory);
    bVar5 = false;
    iVar14 = 1;
    bVar4 = false;
    for (; pAVar7 != (AInventory *)0x0;
        pAVar7 = GC::ReadBarrier<AInventory>((AInventory **)&(pAVar7->super_AActor).Inventory)) {
      bVar3 = DObject::IsKindOf((DObject *)pAVar7,AKey::RegistrationInfo.MyClass);
      bVar11 = bVar5;
      if (bVar3) {
        bVar9 = pAVar7->field_0x4fc;
        if (bVar9 == 0) {
          AActor::GetSpecies((AActor *)&species);
          if (species.Index == this->keySpecies[0].Index) {
            bVar4 = true;
          }
          bVar3 = species.Index == this->keySpecies[1].Index;
        }
        else {
          if (this->conditionalValue[0] == (uint)bVar9) {
            bVar4 = true;
          }
          bVar3 = this->conditionalValue[1] == (uint)bVar9;
        }
        if (bVar3) {
          bVar11 = true;
        }
        if (this->conditionAnd == false) {
          bVar11 = bVar5;
        }
      }
      bVar5 = bVar11;
    }
    if (this->conditionAnd == false) {
      if (bVar4) goto LAB_004b5554;
      goto LAB_004b559a;
    }
    if (!bVar4) {
      iVar14 = (uint)bVar5 * 2 + 1;
      goto LAB_004b559a;
    }
    if (bVar5) goto LAB_004b5554;
    goto LAB_004b5596;
  case ARMORTYPE:
    local_34.Index = 0x60;
    pAVar7 = AActor::FindInventory
                       (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,&local_34);
    if (pAVar7 == (AInventory *)0x0) goto LAB_004b5554;
    iVar14 = *(int *)((long)&pAVar7[1].super_AActor.super_DThinker.super_DObject.ObjNext + 4);
    if (iVar14 == this->armorType[0]) {
      bVar4 = EvaluateOperation(this->conditionalOperator,this->conditionalValue,&pAVar7->Amount);
      iVar14 = *(int *)((long)&pAVar7[1].super_AActor.super_DThinker.super_DObject.ObjNext + 4);
    }
    else {
      bVar4 = false;
    }
    if (iVar14 == this->armorType[1]) {
      bVar5 = EvaluateOperation(this->conditionalOperator + 1,this->conditionalValue + 1,
                                &pAVar7->Amount);
    }
    else {
      bVar5 = false;
    }
    if (this->conditionAnd == true) {
      iVar14 = 3;
      if (bVar4 != false) {
        iVar14 = (uint)(bVar5 ^ 1U) + (uint)(bVar5 ^ 1U) * 2;
      }
      if (bVar5 == false) {
        iVar14 = bVar4 + 1;
        goto LAB_004b559a;
      }
      goto LAB_004b5544;
    }
    if (bVar4 != false) goto LAB_004b5554;
    break;
  default:
    pAVar2 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
    pPVar6 = PClass::FindActor(this->inventoryItem);
    iVar14 = 0;
    pAVar7 = AActor::FindInventory(&pAVar2->super_AActor,pPVar6,false);
    if ((pAVar7 == (AInventory *)0x0) ||
       (bVar4 = EvaluateOperation(this->conditionalOperator,this->conditionalValue,&pAVar7->Amount),
       !bVar4)) {
      iVar14 = 1;
      bVar12 = 1;
      bVar9 = 0;
    }
    else {
      bVar9 = 1;
      bVar12 = 0;
    }
    if (this->conditionAnd != true) {
LAB_004b5544:
      if (iVar14 == 0) {
LAB_004b5554:
        CommandDrawImage::Tick(&this->super_CommandDrawImage,block,statusBar,hudChanged);
        return;
      }
      goto LAB_004b559a;
    }
    pAVar2 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
    pPVar6 = PClass::FindActor(this->inventoryItem + 1);
    pAVar7 = AActor::FindInventory(&pAVar2->super_AActor,pPVar6,false);
    if (pAVar7 == (AInventory *)0x0) {
      if (bVar9 == 0) break;
    }
    else {
      bVar4 = EvaluateOperation(this->conditionalOperator + 1,this->conditionalValue + 1,
                                &pAVar7->Amount);
      if ((bVar9 & bVar4) != 0) goto LAB_004b5554;
      if ((bVar12 & bVar4) != 0) {
        iVar14 = 3;
        goto LAB_004b559a;
      }
      if ((bVar9 & !bVar4) == 0) goto LAB_004b5544;
    }
LAB_004b5596:
    iVar14 = 2;
    goto LAB_004b559a;
  }
  iVar14 = 1;
LAB_004b559a:
  pFVar8 = FImageCollection::operator[](&statusBar->Images,this->conditionalImage[iVar14 - 1]);
  (this->super_CommandDrawImage).texture = pFVar8;
  (this->super_CommandDrawImage).alpha = 1.0;
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			// DrawSwitchable image allows 2 or 4 images to be supplied.
			// drawAlt toggles these:
			// 1 = first image
			// 2 = second image
			// 3 = thrid image
			// 0 = last image
			int drawAlt = 0;
			if(condition == WEAPONSLOT) //weaponslots
			{
				drawAlt = 1; //draw off state until we know we have something.
				for (int i = 0; i < statusBar->CPlayer->weapons.Slots[conditionalValue[0]].Size(); i++)
				{
					PClassActor *weap = statusBar->CPlayer->weapons.Slots[conditionalValue[0]].GetWeapon(i);
					if(weap == NULL)
					{
						continue;
					}
					else if(statusBar->CPlayer->mo->FindInventory(weap) != NULL)
					{
						drawAlt = 0;
						break;
					}
				}
			}
			else if(condition == INVULNERABILITY)
			{
				if(statusBar->CPlayer->cheats&(CF_GODMODE|CF_GODMODE2))
				{
					drawAlt = 1;
				}
			}
			else if(condition == KEYSLOT)
			{
				bool found1 = false;
				bool found2 = false;
				drawAlt = 1;

				for(AInventory *item = statusBar->CPlayer->mo->Inventory;item != NULL;item = item->Inventory)
				{
					if(item->IsKindOf(RUNTIME_CLASS(AKey)))
					{
						int keynum = static_cast<AKey *>(item)->KeyNumber;
						if(keynum)
						{
							if(keynum == conditionalValue[0])
								found1 = true;
							if(conditionAnd && keynum == conditionalValue[1]) // two keys
								found2 = true;
						}
						else
						{
							FName species = item->GetSpecies();
							if(species == keySpecies[0])
								found1 = true;
							if(conditionAnd && species == keySpecies[1])
								found2 = true;
						}
					}
				}

				if(conditionAnd)
				{
					if(found1 && found2)
						drawAlt = 0;
					else if(found1)
						drawAlt = 2;
					else if(found2)
						drawAlt = 3;
				}
				else
				{
					if(found1)
						drawAlt = 0;
				}
			}
			else if(condition == ARMORTYPE)
			{
				ABasicArmor *armor = (ABasicArmor *) statusBar->CPlayer->mo->FindInventory(NAME_BasicArmor);
				if(armor != NULL)
				{
					bool matches1 = armor->ArmorType.GetIndex() == armorType[0] && EvaluateOperation(conditionalOperator[0], conditionalValue[0], armor->Amount);
					bool matches2 = armor->ArmorType.GetIndex() == armorType[1] && EvaluateOperation(conditionalOperator[1], conditionalValue[1], armor->Amount);

					drawAlt = 1;
					if(conditionAnd)
					{
						if(matches1 && matches2)
							drawAlt = 0;
						else if(matches2)
							drawAlt = 3;
						else if(matches1)
							drawAlt = 2;
					}
					else if(matches1)
						drawAlt = 0;
				}
			}
			else //check the inventory items and draw selected sprite
			{
				AInventory* item = statusBar->CPlayer->mo->FindInventory(PClass::FindActor(inventoryItem[0]));
				if(item == NULL || !EvaluateOperation(conditionalOperator[0], conditionalValue[0], item->Amount))
					drawAlt = 1;
				if(conditionAnd)
				{
					item = statusBar->CPlayer->mo->FindInventory(PClass::FindActor(inventoryItem[1]));
					bool secondCondition = item != NULL && EvaluateOperation(conditionalOperator[1], conditionalValue[1], item->Amount);
					if((item != NULL && secondCondition) && drawAlt == 0) //both
					{
						drawAlt = 0;
					}
					else if((item != NULL && secondCondition) && drawAlt == 1) //2nd
					{
						drawAlt = 3;
					}
					else if((item == NULL || !secondCondition) && drawAlt == 0) //1st
					{
						drawAlt = 2;
					}
				}
			}
			if(drawAlt != 0) //draw 'off' image
			{
				texture = statusBar->Images[conditionalImage[drawAlt-1]];

				// Since we're not going to call our parent's tick() method,
				// be sure to set the alpha value properly.
				alpha = 1.;
				return;
			}
			CommandDrawImage::Tick(block, statusBar, hudChanged);
		}